

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O1

void __thiscall cmCPackIFWPackage::DefaultConfiguration(cmCPackIFWPackage *this)

{
  std::__cxx11::string::_M_replace
            ((ulong)this,0,(char *)(this->DisplayName)._M_string_length,0x550243);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Description,0,(char *)(this->Description)._M_string_length,0x550243);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Version,0,(char *)(this->Version)._M_string_length,0x550243);
  std::__cxx11::string::_M_replace
            ((ulong)&this->ReleaseDate,0,(char *)(this->ReleaseDate)._M_string_length,0x550243);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Script,0,(char *)(this->Script)._M_string_length,0x550243);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->Licenses,
                    (this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::_M_replace
            ((ulong)&this->SortingPriority,0,(char *)(this->SortingPriority)._M_string_length,
             0x550243);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Default,0,(char *)(this->Default)._M_string_length,0x550243);
  std::__cxx11::string::_M_replace
            ((ulong)&this->Virtual,0,(char *)(this->Virtual)._M_string_length,0x550243);
  std::__cxx11::string::_M_replace
            ((ulong)&this->ForcedInstallation,0,(char *)(this->ForcedInstallation)._M_string_length,
             0x550243);
  return;
}

Assistant:

void cmCPackIFWPackage::DefaultConfiguration()
{
  DisplayName = "";
  Description = "";
  Version = "";
  ReleaseDate = "";
  Script = "";
  Licenses.clear();
  SortingPriority = "";
  Default = "";
  Virtual = "";
  ForcedInstallation = "";
}